

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O2

int event_base_set(event_base *base,event *ev)

{
  if ((ev->ev_evcallback).evcb_flags == 0x80) {
    event_debug_assert_is_setup_(ev);
    ev->ev_base = base;
    (ev->ev_evcallback).evcb_pri = (uint8_t)(base->nactivequeues / 2);
    return 0;
  }
  return -1;
}

Assistant:

int
event_base_set(struct event_base *base, struct event *ev)
{
	/* Only innocent events may be assigned to a different base */
	if (ev->ev_flags != EVLIST_INIT)
		return (-1);

	event_debug_assert_is_setup_(ev);

	ev->ev_base = base;
	ev->ev_pri = base->nactivequeues/2;

	return (0);
}